

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::store(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  Cell i;
  int iVar3;
  
  requireDStackDepth(this,2,"!");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  iVar3 = 0;
  do {
    dataSpaceSet(this,uVar1 + iVar3,(Char)uVar2);
    uVar2 = uVar2 >> 8;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 4);
  return;
}

Assistant:

void store() {
			REQUIRE_DSTACK_DEPTH(2, "!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "!");
			auto x = dStack.getTop(); pop();
			setDataCell( aaddr , x );
		}